

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ir-builder.cpp
# Opt level: O1

Result<wasm::Ok> * __thiscall
wasm::IRBuilder::makeIf
          (Result<wasm::Ok> *__return_storage_ptr__,IRBuilder *this,Name label,Signature sig)

{
  If *iff;
  
  iff = (If *)MixedArena::allocSpace(&this->wasm->allocator,0x28,8);
  (iff->super_SpecificExpression<(wasm::Expression::Id)2>).super_Expression._id = IfId;
  iff->ifFalse = (Expression *)0x0;
  (iff->super_SpecificExpression<(wasm::Expression::Id)2>).super_Expression.type.id =
       sig.results.id.id;
  visitIfStart(__return_storage_ptr__,this,iff,label,sig.params.id);
  return __return_storage_ptr__;
}

Assistant:

Result<> IRBuilder::makeIf(Name label, Signature sig) {
  auto* iff = wasm.allocator.alloc<If>();
  iff->type = sig.results;
  return visitIfStart(iff, label, sig.params);
}